

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O3

void duckdb::HeapGatherArrayVector
               (Vector *v,idx_t vcount,SelectionVector *sel,data_ptr_t *key_locations)

{
  bool bVar1;
  LogicalType *pLVar2;
  idx_t iVar3;
  Vector *v_00;
  idx_t iVar4;
  data_ptr_t pdVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  idx_t iVar10;
  long lVar11;
  unsigned_long chunk_size;
  SelectionVector array_sel;
  NestedValidity parent_validity;
  data_ptr_t array_entry_locations [2048];
  ulong local_4080;
  SelectionVector local_4078;
  NestedValidity local_4060;
  data_ptr_t local_4038 [2049];
  
  pLVar2 = ArrayType::GetChildType(&v->type);
  iVar3 = ArrayType::GetSize(&v->type);
  v_00 = ArrayVector::GetEntry(v);
  iVar4 = GetTypeIdSize(pLVar2->physical_type_);
  bVar1 = TypeIsConstantSize(pLVar2->physical_type_);
  if (vcount != 0) {
    iVar10 = 0;
    do {
      pdVar5 = key_locations[iVar10];
      key_locations[iVar10] = pdVar5 + (iVar3 + 7 >> 3);
      NestedValidity::NestedValidity(&local_4060,pdVar5);
      if (bVar1) {
        plVar9 = (long *)0x0;
      }
      else {
        plVar9 = (long *)key_locations[iVar10];
        key_locations[iVar10] = (data_ptr_t)(plVar9 + iVar3);
      }
      iVar6 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar10];
      }
      if (iVar3 != 0) {
        lVar11 = iVar6 * iVar3;
        iVar6 = iVar3;
        do {
          uVar8 = 0x800;
          if (iVar6 < 0x800) {
            uVar8 = iVar6;
          }
          local_4080 = uVar8;
          SelectionVector::SelectionVector(&local_4078,0x800);
          pdVar5 = key_locations[iVar10];
          if (bVar1) {
            uVar7 = 0;
            do {
              local_4038[uVar7] = pdVar5;
              pdVar5 = pdVar5 + iVar4;
              local_4078.sel_vector[uVar7] = (int)lVar11 + (int)uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
            key_locations[iVar10] = pdVar5;
          }
          else {
            uVar7 = 0;
            do {
              local_4038[uVar7] = pdVar5;
              pdVar5 = pdVar5 + *plVar9;
              key_locations[iVar10] = pdVar5;
              plVar9 = plVar9 + 1;
              local_4078.sel_vector[uVar7] = (int)lVar11 + (int)uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          RowOperations::HeapGather(v_00,&local_4080,&local_4078,local_4038,&local_4060);
          local_4060.list_validity_offset = local_4060.list_validity_offset + uVar8;
          if (local_4078.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4078.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          iVar6 = iVar6 - uVar8;
          lVar11 = lVar11 + uVar8;
        } while (iVar6 != 0);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != vcount);
  }
  return;
}

Assistant:

static void HeapGatherArrayVector(Vector &v, const idx_t vcount, const SelectionVector &sel,
                                  data_ptr_t *key_locations) {
	// Setup
	auto &child_type = ArrayType::GetChildType(v.GetType());
	auto array_size = ArrayType::GetSize(v.GetType());
	auto &child_vector = ArrayVector::GetEntry(v);
	auto child_type_size = GetTypeIdSize(child_type.InternalType());
	auto child_type_is_var_size = !TypeIsConstantSize(child_type.InternalType());

	data_ptr_t array_entry_locations[STANDARD_VECTOR_SIZE];

	// array must have a validitymask for its elements
	auto array_validitymask_size = (array_size + 7) / 8;

	for (idx_t i = 0; i < vcount; i++) {
		// Setup validity mask
		data_ptr_t array_validitymask_location = key_locations[i];
		key_locations[i] += array_validitymask_size;

		NestedValidity parent_validity(array_validitymask_location);

		// The size of each variable size entry is stored after the validity mask
		// (if the child type is variable size)
		data_ptr_t var_entry_size_ptr = nullptr;
		if (child_type_is_var_size) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += array_size * sizeof(idx_t);
		}

		// row idx
		const auto row_idx = sel.get_index(i);

		idx_t array_start = row_idx * array_size;
		idx_t elem_remaining = array_size;

		while (elem_remaining > 0) {
			auto chunk_size = MinValue(static_cast<idx_t>(STANDARD_VECTOR_SIZE), elem_remaining);

			SelectionVector array_sel(STANDARD_VECTOR_SIZE);

			if (child_type_is_var_size) {
				// variable size list entries
				for (idx_t elem_idx = 0; elem_idx < chunk_size; elem_idx++) {
					array_entry_locations[elem_idx] = key_locations[i];
					key_locations[i] += Load<idx_t>(var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
					array_sel.set_index(elem_idx, array_start + elem_idx);
				}
			} else {
				// constant size list entries
				for (idx_t elem_idx = 0; elem_idx < chunk_size; elem_idx++) {
					array_entry_locations[elem_idx] = key_locations[i];
					key_locations[i] += child_type_size;
					array_sel.set_index(elem_idx, array_start + elem_idx);
				}
			}

			// Pass on this array's validity mask to the child vector
			RowOperations::HeapGather(child_vector, chunk_size, array_sel, array_entry_locations, &parent_validity);

			elem_remaining -= chunk_size;
			array_start += chunk_size;
			parent_validity.OffsetListBy(chunk_size);
		}
	}
}